

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Wrap v)

{
  Wrap v_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"useMetadata");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"black");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"clamp");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"repeat");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mirror");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::UsdUVTexture::Wrap v) {
  std::string s;

  switch (v) {
    case tinyusdz::UsdUVTexture::Wrap::UseMetadata: {
      s = "useMetadata";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Black: {
      s = "black";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Clamp: {
      s = "clamp";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Repeat: {
      s = "repeat";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Mirror: {
      s = "mirror";
      break;
    }
  }

  return s;
}